

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall ObjectTest_basic_set_list_Test::TestBody(ObjectTest_basic_set_list_Test *this)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar1;
  _List_node_base *p_Var2;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  _List_node_base *p_Var5;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  char *pcVar7;
  pointer *__ptr_11;
  pointer *__ptr;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  object obj;
  AssertHelper local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a0;
  size_t local_98;
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_88;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_68;
  char local_38;
  
  local_68._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_38 = '\0';
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<bool>,std::_List_iterator<bool>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<bool> *)local_a8,
             (_List_iterator<bool> *)&local_88);
  _Var4._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_c8._0_8_;
  while (_Var4._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl !=
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var4._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    operator_delete((void *)_Var4._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,0x18);
    _Var4._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )tVar1.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<bool> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21c,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<bool,_std::allocator<bool>_>,_std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            ((list<bool,_std::allocator<bool>_> *)local_c8,(object *)&local_68._M_first,
             (list<bool,_std::allocator<bool>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<bool,std::allocator<bool>>,std::__cxx11::list<bool,std::allocator<bool>>>
            ((internal *)local_d8,"obj .get< std::list<bool> >()","std::list<bool> {}",
             (list<bool,_std::allocator<bool>_> *)local_c8,
             (list<bool,_std::allocator<bool>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<signed_char>,std::_List_iterator<signed_char>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<signed_char> *)local_a8,
             (_List_iterator<signed_char> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<signed char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21d,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((list<signed_char,_std::allocator<signed_char>_> *)local_c8,
             (object *)&local_68._M_first,
             (list<signed_char,_std::allocator<signed_char>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<signed_char,std::allocator<signed_char>>,std::__cxx11::list<signed_char,std::allocator<signed_char>>>
            ((internal *)local_d8,"obj .get< std::list<signed char> >()","std::list<signed char> {}"
             ,(list<signed_char,_std::allocator<signed_char>_> *)local_c8,
             (list<signed_char,_std::allocator<signed_char>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<signed_char,_std::allocator<signed_char>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<signed_char,_std::allocator<signed_char>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<unsigned_char>,std::_List_iterator<unsigned_char>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<unsigned_char> *)local_a8,
             (_List_iterator<unsigned_char> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<unsigned char> >()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21e,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
             (object *)&local_68._M_first,
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>,std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)local_d8,"obj .get< std::list<unsigned char> >()",
             "std::list<unsigned char> {}",
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var5->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var5->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<short>,std::_List_iterator<short>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<short> *)local_a8,
             (_List_iterator<short> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<short> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21f,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<short,_std::allocator<short>_>,_std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            ((list<short,_std::allocator<short>_> *)local_c8,(object *)&local_68._M_first,
             (list<short,_std::allocator<short>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<short,std::allocator<short>>,std::__cxx11::list<short,std::allocator<short>>>
            ((internal *)local_d8,"obj .get< std::list<short> >()","std::list<short> {}",
             (list<short,_std::allocator<short>_> *)local_c8,
             (list<short,_std::allocator<short>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<short,_std::allocator<short>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<short,_std::allocator<short>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x21f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<int>,std::_List_iterator<int>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<int> *)local_a8,(_List_iterator<int> *)&local_88)
  ;
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<int> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x220,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<int,_std::allocator<int>_>,_std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            ((list<int,_std::allocator<int>_> *)local_c8,(object *)&local_68._M_first,
             (list<int,_std::allocator<int>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<int,std::allocator<int>>,std::__cxx11::list<int,std::allocator<int>>>
            ((internal *)local_d8,"obj .get< std::list<int> >()","std::list<int> {}",
             (list<int,_std::allocator<int>_> *)local_c8,
             (list<int,_std::allocator<int>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x220,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<long>,std::_List_iterator<long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<long> *)local_a8,
             (_List_iterator<long> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x221,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((list<long,_std::allocator<long>_> *)local_c8,(object *)&local_68._M_first,
             (list<long,_std::allocator<long>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long,std::allocator<long>>,std::__cxx11::list<long,std::allocator<long>>>
            ((internal *)local_d8,"obj .get< std::list<long> >()","std::list<long> {}",
             (list<long,_std::allocator<long>_> *)local_c8,
             (list<long,_std::allocator<long>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<long,_std::allocator<long>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<long,_std::allocator<long>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x221,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<long_long>,std::_List_iterator<long_long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<long_long> *)local_a8,
             (_List_iterator<long_long> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<long long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x222,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((list<long_long,_std::allocator<long_long>_> *)local_c8,(object *)&local_68._M_first,
             (list<long_long,_std::allocator<long_long>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long_long,std::allocator<long_long>>,std::__cxx11::list<long_long,std::allocator<long_long>>>
            ((internal *)local_d8,"obj .get< std::list<long long> >()","std::list<long long> {}",
             (list<long_long,_std::allocator<long_long>_> *)local_c8,
             (list<long_long,_std::allocator<long_long>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<long_long,_std::allocator<long_long>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<long_long,_std::allocator<long_long>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x222,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<long>,std::_List_iterator<long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<long> *)local_a8,
             (_List_iterator<long> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<intmax_t> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x223,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((list<long,_std::allocator<long>_> *)local_c8,(object *)&local_68._M_first,
             (list<long,_std::allocator<long>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long,std::allocator<long>>,std::__cxx11::list<long,std::allocator<long>>>
            ((internal *)local_d8,"obj .get< std::list<intmax_t> >()","std::list<intmax_t> {}",
             (list<long,_std::allocator<long>_> *)local_c8,
             (list<long,_std::allocator<long>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<long,_std::allocator<long>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<long,_std::allocator<long>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x223,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<float>,std::_List_iterator<float>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<float> *)local_a8,
             (_List_iterator<float> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<float> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x224,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<float,_std::allocator<float>_>,_std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            ((list<float,_std::allocator<float>_> *)local_c8,(object *)&local_68._M_first,
             (list<float,_std::allocator<float>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<float,std::allocator<float>>,std::__cxx11::list<float,std::allocator<float>>>
            ((internal *)local_d8,"obj .get< std::list<float> >()","std::list<float> {}",
             (list<float,_std::allocator<float>_> *)local_c8,
             (list<float,_std::allocator<float>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<float,_std::allocator<float>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<float,_std::allocator<float>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x224,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<double>,std::_List_iterator<double>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<double> *)local_a8,
             (_List_iterator<double> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x225,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<double,_std::allocator<double>_>,_std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            ((list<double,_std::allocator<double>_> *)local_c8,(object *)&local_68._M_first,
             (list<double,_std::allocator<double>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<double,std::allocator<double>>,std::__cxx11::list<double,std::allocator<double>>>
            ((internal *)local_d8,"obj .get< std::list<double> >()","std::list<double> {}",
             (list<double,_std::allocator<double>_> *)local_c8,
             (list<double,_std::allocator<double>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<double,_std::allocator<double>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x18);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<double,_std::allocator<double>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x225,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<long_double>,std::_List_iterator<long_double>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<long_double> *)local_a8,
             (_List_iterator<long_double> *)&local_88);
  _Var6._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_;
  while (_Var6._M_head_impl !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    _Var3._M_head_impl = *_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x20);
    _Var6._M_head_impl = _Var3._M_head_impl;
  }
  local_a8._1_7_ = (undefined7)((ulong)local_a8 >> 8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<long double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x226,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((list<long_double,_std::allocator<long_double>_> *)local_c8,
             (object *)&local_68._M_first,
             (list<long_double,_std::allocator<long_double>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long_double,std::allocator<long_double>>,std::__cxx11::list<long_double,std::allocator<long_double>>>
            ((internal *)local_d8,"obj .get< std::list<long double> >()","std::list<long double> {}"
             ,(list<long_double,_std::allocator<long_double>_> *)local_c8,
             (list<long_double,_std::allocator<long_double>_> *)&local_88);
  p_Var5 = local_88._M_impl._M_node.super__List_node_base._M_next;
  while (_Var6._M_head_impl =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_,
        p_Var5 != (_List_node_base *)&local_88) {
    p_Var2 = (((_List_base<long_double,_std::allocator<long_double>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x20);
    p_Var5 = p_Var2;
  }
  while (p_Var5 = (_List_node_base *)local_a8,
        _Var6._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var6._M_head_impl;
    operator_delete(_Var6._M_head_impl,0x20);
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  while (p_Var5 != (_List_node_base *)local_a8) {
    p_Var2 = (((_List_base<long_double,_std::allocator<long_double>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x20);
    p_Var5 = p_Var2;
  }
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x226,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::_List_iterator<std::__cxx11::u8string>,std::_List_iterator<std::__cxx11::u8string>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (_List_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              *)local_a8,
             (_List_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              *)&local_88);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_c8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<std::u8string> >()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x227,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_c8,(object *)&local_68._M_first,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>,std::__cxx11::list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_d8,"obj .get< std::list<std::u8string> >()",
             "std::list<std::u8string> {}",
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_c8,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_88);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear(&local_88);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_c8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_a8);
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x227,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)local_c8._0_8_)->_M_impl)._M_node.
                 super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_c8._16_8_ = 0;
  local_c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  local_a8 = (undefined1  [8])local_c8;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_List_iterator<jessilib::object>,std::_List_iterator<jessilib::object>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_List_iterator<jessilib::object> *)local_a8,
             (_List_iterator<jessilib::object> *)&local_88);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8);
  local_a8[0] = local_38 == '\x06';
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c8,local_a8,"obj .has< std::list<object> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x228,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_88._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_88._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),pbStack_a0);
  }
  local_98 = 0;
  local_a8 = (undefined1  [8])local_a8;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  jessilib::object::
  get<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((list<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8,
             (object *)&local_68._M_first,
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)local_a8);
  local_88._M_impl._M_node._M_size = 0;
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_88;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<jessilib::object,std::allocator<jessilib::object>>,std::__cxx11::list<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)local_d8,"obj .get< std::list<object> >()","std::list<object> {}",
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8,
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_88);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_88);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_a8);
  if (local_d8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x228,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)local_c8._0_8_)->_M_node).super__List_node_base._M_next)->_M_prev)
                ();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_68._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_list) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::list<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::list<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::list<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::list<short>);
	OBJECT_BASIC_SET_TEST(obj, std::list<int>);
	OBJECT_BASIC_SET_TEST(obj, std::list<long>);
	OBJECT_BASIC_SET_TEST(obj, std::list<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::list<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::list<float>);
	OBJECT_BASIC_SET_TEST(obj, std::list<double>);
	OBJECT_BASIC_SET_TEST(obj, std::list<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::list<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::list<object>);
}